

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfBufferInline.h
# Opt level: O2

sbfBuffer sbfBuffer_new(sbfPool pool,size_t size)

{
  sbfBuffer psVar1;
  
  psVar1 = (sbfBuffer)sbfMemory_malloc(pool + 1);
  psVar1->mAllocated = 1;
  psVar1->mDestroyClosure = (void *)0x0;
  psVar1->mDestroyCb = (sbfBufferDestroyCb)0x0;
  psVar1->mDestroyData = (void *)0x0;
  psVar1->mData = psVar1 + 1;
  psVar1->mSize = (size_t)pool;
  psVar1->mRefCount = 1;
  psVar1->mLocked = 0;
  psVar1->mOwner = (void *)0x0;
  return psVar1;
}

Assistant:

static SBF_INLINE sbfBuffer
sbfBuffer_new (sbfPool pool, size_t size)
{
    sbfBuffer buffer;

    if (pool == NULL)
    {
#ifdef WIN32
        buffer = (sbfBuffer)LocalAlloc (0, (sizeof *buffer) + size);
#else
        buffer = (sbfBuffer)xmalloc ((sizeof *buffer) + size);
#endif
        buffer->mAllocated = 1;
    }
    else
    {
        buffer = (sbfBuffer)sbfPool_get (pool);
        buffer->mAllocated = 0;
    }

    buffer->mDestroyCb = NULL;
    buffer->mDestroyData = NULL;
    buffer->mDestroyClosure = NULL;

    buffer->mData = buffer + 1;
    buffer->mSize = size;

    sbfRefCount_init (&buffer->mRefCount, 1);
    buffer->mLocked = 0;

    buffer->mOwner = NULL;

    return buffer;
}